

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::SPxSolverBase<double>::getDualSol(SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  SPxSense SVar1;
  Status *pSVar2;
  pointer pdVar3;
  UpdateVector<double> *pUVar4;
  SPxId *pSVar5;
  int iVar6;
  Status SVar7;
  long lVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  double dVar13;
  DataKey local_58;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (this->initialized == false) {
    SVar7 = status(this);
    if (SVar7 != NO_PROBLEM) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XSOLVE08 No Problem loaded","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar9 = &PTR__SPxException_006aa100;
      __cxa_throw(puVar9,&SPxStatusException::typeinfo,SPxException::~SPxException);
    }
  }
  else {
    if (this->theRep == ROW) {
      VectorBase<double>::operator=
                (p_vector,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object);
      lVar8 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thenum;
      if (0 < lVar8) {
        lVar8 = lVar8 + 1;
        do {
          pSVar5 = (this->super_SPxBasisBase<double>).theBaseId.data;
          if ((int)(pSVar5[lVar8 + -2].super_DataKey.info & -0x80000000) != 0) {
            dVar13 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8 + 0xfffffffffffffffe];
            local_58 = pSVar5[lVar8 + -2].super_DataKey;
            SPxRowId::SPxRowId((SPxRowId *)&local_50,(SPxId *)&local_58);
            iVar6 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                              (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                super_SVSetBase<double>.set,&local_50);
            (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6] = dVar13;
          }
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
    }
    else {
      lVar8 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum;
      if (0 < lVar8) {
        pSVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        pdVar3 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pUVar4 = this->theCoPvec;
        lVar11 = 0;
        do {
          uVar12 = pSVar2[lVar11] + P_FREE;
          if ((7 < uVar12) || (dVar13 = 0.0, (0xabU >> (uVar12 & 0x1f) & 1) == 0)) {
            dVar13 = (pUVar4->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
          }
          pdVar3[lVar11] = dVar13;
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
    }
    pdVar3 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (uint)((ulong)((long)(p_vector->val).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
    if (0 < (int)uVar12) {
      SVar1 = (this->super_SPxLPBase<double>).thesense;
      uVar10 = 0;
      do {
        pdVar3[uVar10] = pdVar3[uVar10] * (double)SVar1;
        uVar10 = uVar10 + 1;
      } while ((uVar12 & 0x7fffffff) != uVar10);
    }
  }
  SVar7 = status(this);
  return SVar7;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE08 No Problem loaded");
   }

   if(rep() == ROW)
   {
      int i;
      p_vector = this->maxRowObj();

      for(i = this->nCols() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = fVec()[i];
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nRows(); ++i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = (*theCoPvec)[i];
         }
      }
   }

   p_vector *= Real(this->spxSense());

   return status();
}